

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Infofnt_text_non(wchar_t x,wchar_t y,wchar_t *str,wchar_t len)

{
  void *pvVar1;
  size_t sVar2;
  term_data *td;
  wchar_t h;
  wchar_t w;
  wchar_t len_local;
  wchar_t *str_local;
  wchar_t y_local;
  wchar_t x_local;
  
  pvVar1 = Term->data;
  h = len;
  if (len < L'\0') {
    sVar2 = wcslen(str);
    h = (wchar_t)sVar2;
  }
  XFillRectangle(Metadpy->dpy,Infowin->win,Infoclr->gc,
                 x * *(int *)((long)pvVar1 + 0xe8) + (int)Infowin->ox,
                 y * *(int *)((long)pvVar1 + 0xf0) + (int)Infowin->oy,
                 h * *(int *)((long)pvVar1 + 0xe8),*(int *)((long)pvVar1 + 0xf0));
  return 0;
}

Assistant:

static errr Infofnt_text_non(int x, int y, const wchar_t *str, int len)
{
	int w, h;

	term_data *td = (term_data*)(Term->data);

	/*** Find the width ***/

	/* Negative length is a flag to count the characters in str */
	if (len < 0) len = wcslen(str);

	/* The total width will be 'len' chars * standard width */
	w = len * td->tile_wid;

	/*** Find the X dimensions ***/

	/* Line up with x at left edge of column 'x' */
	x = x * td->tile_wid + Infowin->ox;

	/*** Find other dimensions ***/

	/* Simply do 'td->tile_hgt' (a single row) high */
	h = td->tile_hgt;

	/* Simply do "at top" in row 'y' */
	y = y * h + Infowin->oy;

	/*** Actually 'paint' the area ***/

	/* Just do a Fill Rectangle */
	XFillRectangle(Metadpy->dpy, Infowin->win, Infoclr->gc, x, y, w, h);

	/* Success */
	return (0);
}